

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t zeGetMemProcAddrTable(ze_api_version_t version,ze_mem_dditable_t *pDdiTable)

{
  ze_result_t result;
  ze_mem_dditable_t *pDdiTable_local;
  ze_api_version_t version_local;
  
  if (pDdiTable == (ze_mem_dditable_t *)0x0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (driver::context < (int)version) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
  }
  else {
    pDdiTable->pfnAllocShared = driver::zeMemAllocShared;
    pDdiTable->pfnAllocDevice = driver::zeMemAllocDevice;
    pDdiTable->pfnAllocHost = driver::zeMemAllocHost;
    pDdiTable->pfnFree = driver::zeMemFree;
    pDdiTable->pfnGetAllocProperties = driver::zeMemGetAllocProperties;
    pDdiTable->pfnGetAddressRange = driver::zeMemGetAddressRange;
    pDdiTable->pfnGetIpcHandle = driver::zeMemGetIpcHandle;
    pDdiTable->pfnOpenIpcHandle = driver::zeMemOpenIpcHandle;
    pDdiTable->pfnCloseIpcHandle = driver::zeMemCloseIpcHandle;
    pDdiTable->pfnFreeExt = driver::zeMemFreeExt;
    pDdiTable->pfnPutIpcHandle = driver::zeMemPutIpcHandle;
    pDdiTable->pfnGetPitchFor2dImage = driver::zeMemGetPitchFor2dImage;
    pDdiTable_local._4_4_ = ZE_RESULT_SUCCESS;
  }
  return pDdiTable_local._4_4_;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetMemProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_mem_dditable_t* pDdiTable                    ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( driver::context.version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    pDdiTable->pfnAllocShared                            = driver::zeMemAllocShared;

    pDdiTable->pfnAllocDevice                            = driver::zeMemAllocDevice;

    pDdiTable->pfnAllocHost                              = driver::zeMemAllocHost;

    pDdiTable->pfnFree                                   = driver::zeMemFree;

    pDdiTable->pfnGetAllocProperties                     = driver::zeMemGetAllocProperties;

    pDdiTable->pfnGetAddressRange                        = driver::zeMemGetAddressRange;

    pDdiTable->pfnGetIpcHandle                           = driver::zeMemGetIpcHandle;

    pDdiTable->pfnOpenIpcHandle                          = driver::zeMemOpenIpcHandle;

    pDdiTable->pfnCloseIpcHandle                         = driver::zeMemCloseIpcHandle;

    pDdiTable->pfnFreeExt                                = driver::zeMemFreeExt;

    pDdiTable->pfnPutIpcHandle                           = driver::zeMemPutIpcHandle;

    pDdiTable->pfnGetPitchFor2dImage                     = driver::zeMemGetPitchFor2dImage;

    return result;
}